

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhash.cpp
# Opt level: O2

void __thiscall CVmHashTable::move_entries_to(CVmHashTable *this,CVmHashTable *new_tab)

{
  CVmHashEntry *pCVar1;
  CVmHashEntry *entry;
  ulong uVar2;
  CVmHashEntry **ppCVar3;
  
  ppCVar3 = this->table_;
  for (uVar2 = 0; uVar2 < this->table_size_; uVar2 = uVar2 + 1) {
    entry = *ppCVar3;
    while (entry != (CVmHashEntry *)0x0) {
      pCVar1 = entry->nxt_;
      entry->nxt_ = (CVmHashEntry *)0x0;
      add(new_tab,entry);
      entry = pCVar1;
    }
    *ppCVar3 = (CVmHashEntry *)0x0;
    ppCVar3 = ppCVar3 + 1;
  }
  return;
}

Assistant:

void CVmHashTable::move_entries_to(CVmHashTable *new_tab)
{
    CVmHashEntry **tableptr;
    size_t i;

    /* go through each hash value */
    for (tableptr = table_, i = 0 ; i < table_size_ ; ++i, ++tableptr)
    {
        CVmHashEntry *entry;
        CVmHashEntry *nxt;

        /* go through each entry at this hash value */
        for (entry = *tableptr ; entry ; entry = nxt)
        {
            /* 
             *   remember the next entry, since we'll be unlinking it from
             *   this table, which will render the nxt_ member unusable
             *   for the purposes of completing this enumeration 
             */
            nxt = entry->nxt_;

            /* 
             *   clear the 'next' pointer in this entry, to unlink it from
             *   our table - since everything is being removed, there's no
             *   need to worry about what came before us 
             */
            entry->nxt_ = 0;

            /* add the entry to the new hash table */
            new_tab->add(entry);
        }

        /* 
         *   clear this hash value chain head - we've now removed
         *   everything from it 
         */
        *tableptr = 0;
    }
}